

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O3

int __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::init
          (GeometryShader_gl_in_ArrayLengthTest *this,EVP_PKEY_CTX *ctx)

{
  testContainer *this_00;
  GLenum GVar1;
  int iVar2;
  deUint32 dVar3;
  int extraout_EAX;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  _Elt_pointer ppCVar5;
  _Elt_pointer ppCVar6;
  _Map_pointer pppCVar7;
  char *captured_varyings [1];
  Case *local_40;
  char *local_38;
  long lVar4;
  
  TestCaseBase::init(&this->super_TestCaseBase,ctx);
  local_38 = "in_array_size";
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    local_40 = &this->m_test_lines;
    (this->m_test_lines).po_id = 0;
    (this->m_test_lines).vs_id = 0;
    *(undefined8 *)&(this->m_test_lines).expected_array_length = 0;
    (this->m_test_lines).input_body_part = (GLchar *)0x0;
    (this->m_test_lines).output_body_part = (GLchar *)0x0;
    (this->m_test_lines).tf_mode = 0;
    (this->m_test_lines).fs_id = 0;
    *(undefined8 *)&(this->m_test_lines).gs_id = 0;
    (this->m_test_lines).draw_call_mode = 1;
    (this->m_test_lines).draw_call_n_vertices = 2;
    (this->m_test_lines).expected_array_length = 2;
    (this->m_test_lines).input_body_part = "layout(lines)                      in;\n";
    (this->m_test_lines).output_body_part =
         "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n";
    this_00 = &this->m_tests;
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
    ::emplace_back<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>
              ((deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
                *)this_00,&local_40);
    local_40 = &this->m_test_lines_adjacency;
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.LINES_ADJACENCY;
    (this->m_test_lines_adjacency).po_id = 0;
    (this->m_test_lines_adjacency).vs_id = 0;
    *(undefined8 *)&(this->m_test_lines_adjacency).expected_array_length = 0;
    (this->m_test_lines_adjacency).input_body_part = (GLchar *)0x0;
    (this->m_test_lines_adjacency).output_body_part = (GLchar *)0x0;
    (this->m_test_lines_adjacency).tf_mode = 0;
    (this->m_test_lines_adjacency).fs_id = 0;
    *(undefined8 *)&(this->m_test_lines_adjacency).gs_id = 0;
    (this->m_test_lines_adjacency).draw_call_mode = GVar1;
    (this->m_test_lines_adjacency).draw_call_n_vertices = 4;
    (this->m_test_lines_adjacency).expected_array_length = 4;
    (this->m_test_lines_adjacency).input_body_part = "layout(lines_adjacency)            in;\n";
    (this->m_test_lines_adjacency).output_body_part =
         "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n";
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
    ::emplace_back<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>
              ((deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
                *)this_00,&local_40);
    local_40 = &this->m_test_points;
    (this->m_test_points).po_id = 0;
    (this->m_test_points).vs_id = 0;
    *(undefined8 *)&(this->m_test_points).expected_array_length = 0;
    (this->m_test_points).input_body_part = (GLchar *)0x0;
    (this->m_test_points).output_body_part = (GLchar *)0x0;
    (this->m_test_points).tf_mode = 0;
    (this->m_test_points).fs_id = 0;
    *(undefined8 *)&(this->m_test_points).gs_id = 0;
    (this->m_test_points).draw_call_mode = 0;
    (this->m_test_points).draw_call_n_vertices = 1;
    (this->m_test_points).expected_array_length = 1;
    (this->m_test_points).input_body_part = "layout(points)                     in;\n";
    (this->m_test_points).output_body_part =
         "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n";
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
    ::emplace_back<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>
              ((deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
                *)this_00,&local_40);
    local_40 = &this->m_test_triangles;
    (this->m_test_triangles).po_id = 0;
    (this->m_test_triangles).vs_id = 0;
    *(undefined8 *)&(this->m_test_triangles).expected_array_length = 0;
    (this->m_test_triangles).input_body_part = (GLchar *)0x0;
    (this->m_test_triangles).output_body_part = (GLchar *)0x0;
    (this->m_test_triangles).tf_mode = 0;
    (this->m_test_triangles).fs_id = 0;
    *(undefined8 *)&(this->m_test_triangles).gs_id = 0;
    (this->m_test_triangles).draw_call_mode = 4;
    (this->m_test_triangles).draw_call_n_vertices = 3;
    (this->m_test_triangles).expected_array_length = 3;
    (this->m_test_triangles).input_body_part = "layout(triangles)                  in;\n";
    (this->m_test_triangles).output_body_part =
         "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n";
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
    ::emplace_back<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>
              ((deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
                *)this_00,&local_40);
    local_40 = &this->m_test_triangles_adjacency;
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.TRIANGLE_STRIP_ADJACENCY;
    (this->m_test_triangles_adjacency).po_id = 0;
    (this->m_test_triangles_adjacency).vs_id = 0;
    *(undefined8 *)&(this->m_test_triangles_adjacency).expected_array_length = 0;
    (this->m_test_triangles_adjacency).input_body_part = (GLchar *)0x0;
    (this->m_test_triangles_adjacency).output_body_part = (GLchar *)0x0;
    (this->m_test_triangles_adjacency).tf_mode = 0;
    (this->m_test_triangles_adjacency).fs_id = 0;
    *(undefined8 *)&(this->m_test_triangles_adjacency).gs_id = 0;
    (this->m_test_triangles_adjacency).draw_call_mode = GVar1;
    (this->m_test_triangles_adjacency).draw_call_n_vertices = 6;
    (this->m_test_triangles_adjacency).expected_array_length = 6;
    (this->m_test_triangles_adjacency).input_body_part = "layout(triangles_adjacency)        in;\n";
    (this->m_test_triangles_adjacency).output_body_part =
         "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n";
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
    ::emplace_back<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>
              ((deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
                *)this_00,&local_40);
    local_40 = &this->m_test_lines_adjacency_to_line_strip;
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.LINES_ADJACENCY;
    (this->m_test_lines_adjacency_to_line_strip).po_id = 0;
    (this->m_test_lines_adjacency_to_line_strip).vs_id = 0;
    *(undefined8 *)&(this->m_test_lines_adjacency_to_line_strip).expected_array_length = 0;
    (this->m_test_lines_adjacency_to_line_strip).input_body_part = (GLchar *)0x0;
    (this->m_test_lines_adjacency_to_line_strip).output_body_part = (GLchar *)0x0;
    (this->m_test_lines_adjacency_to_line_strip).tf_mode = 0;
    (this->m_test_lines_adjacency_to_line_strip).fs_id = 0;
    *(undefined8 *)&(this->m_test_lines_adjacency_to_line_strip).gs_id = 0;
    (this->m_test_lines_adjacency_to_line_strip).draw_call_mode = GVar1;
    (this->m_test_lines_adjacency_to_line_strip).draw_call_n_vertices = 4;
    (this->m_test_lines_adjacency_to_line_strip).expected_array_length = 4;
    (this->m_test_lines_adjacency_to_line_strip).input_body_part =
         "layout(lines_adjacency)            in;\n";
    (this->m_test_lines_adjacency_to_line_strip).output_body_part =
         "layout(line_strip, max_vertices=2) out;\n\n#define N_OUT_VERTICES (2)\n";
    (this->m_test_lines_adjacency_to_line_strip).tf_mode = 1;
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
    ::emplace_back<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>
              ((deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
                *)this_00,&local_40);
    local_40 = &this->m_test_triangles_adjacency_to_triangle_strip;
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.TRIANGLE_STRIP_ADJACENCY;
    (this->m_test_triangles_adjacency_to_triangle_strip).po_id = 0;
    (this->m_test_triangles_adjacency_to_triangle_strip).vs_id = 0;
    *(undefined8 *)&(this->m_test_triangles_adjacency_to_triangle_strip).expected_array_length = 0;
    (this->m_test_triangles_adjacency_to_triangle_strip).input_body_part = (GLchar *)0x0;
    (this->m_test_triangles_adjacency_to_triangle_strip).output_body_part = (GLchar *)0x0;
    (this->m_test_triangles_adjacency_to_triangle_strip).tf_mode = 0;
    (this->m_test_triangles_adjacency_to_triangle_strip).fs_id = 0;
    *(undefined8 *)&(this->m_test_triangles_adjacency_to_triangle_strip).gs_id = 0;
    (this->m_test_triangles_adjacency_to_triangle_strip).draw_call_mode = GVar1;
    (this->m_test_triangles_adjacency_to_triangle_strip).draw_call_n_vertices = 6;
    (this->m_test_triangles_adjacency_to_triangle_strip).expected_array_length = 6;
    (this->m_test_triangles_adjacency_to_triangle_strip).input_body_part =
         "layout(triangles_adjacency)        in;\n";
    (this->m_test_triangles_adjacency_to_triangle_strip).output_body_part =
         "layout(triangle_strip, max_vertices=3) out;\n\n#define N_OUT_VERTICES (3)\n";
    (this->m_test_triangles_adjacency_to_triangle_strip).tf_mode = 4;
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
    ::emplace_back<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>
              ((deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*,std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case*>>
                *)this_00,&local_40);
    ppCVar6 = (this->m_tests).
              super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (ppCVar6 !=
        (this->m_tests).
        super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ppCVar5 = (this->m_tests).
                super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      pppCVar7 = (this->m_tests).
                 super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        initCaseProgram(this,*ppCVar6,&local_38,1);
        ppCVar6 = ppCVar6 + 1;
        if (ppCVar6 == ppCVar5) {
          ppCVar6 = pppCVar7[1];
          pppCVar7 = pppCVar7 + 1;
          ppCVar5 = ppCVar6 + 0x40;
        }
      } while (ppCVar6 !=
               (this->m_tests).
               super__Deque_base<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur);
    }
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_buffer_object_id);
    (**(code **)(lVar4 + 0x40))(0x8892,this->m_buffer_object_id);
    (**(code **)(lVar4 + 0x150))(0x8892,0x18,0,0x88e4);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create buffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x283);
    (**(code **)(lVar4 + 0x708))(1,&this->m_vertex_array_object_id);
    (**(code **)(lVar4 + 0xd8))(this->m_vertex_array_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x289);
    return extraout_EAX;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
             ,0x243);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShader_gl_in_ArrayLengthTest::init()
{
	/* Initialize Base */
	TestCaseBase::init();

	/* Captured variables */
	const char* captured_varyings[] = { "in_array_size" };

	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up test descriptors */
	initCase(m_test_lines, GL_LINES, 2, /* number of vertices */
			 2,							/* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_lines, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_lines);

	initCase(m_test_lines_adjacency, m_glExtTokens.LINES_ADJACENCY, 4, /* number of vertices */
			 4,														   /* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_lines_with_adjacency, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_lines_adjacency);

	initCase(m_test_points, GL_POINTS, 1, /* number of vertices */
			 1,							  /* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_points, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_points);

	initCase(m_test_triangles, GL_TRIANGLES, 3, /* number of vertices */
			 3,									/* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_triangles, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_triangles);

	initCase(m_test_triangles_adjacency, m_glExtTokens.TRIANGLE_STRIP_ADJACENCY, 6, /* number of vertices */
			 6,																		/* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_triangles_with_adjacency, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_triangles_adjacency);

	initCase(m_test_lines_adjacency_to_line_strip, m_glExtTokens.LINES_ADJACENCY, 4 /* number of vertices */,
			 4 /* expected array length */, GL_LINES, m_geometry_shader_code_input_lines_with_adjacency,
			 m_geometry_shader_code_output_line_strip);

	m_tests.push_back(&m_test_lines_adjacency_to_line_strip);

	initCase(m_test_triangles_adjacency_to_triangle_strip, m_glExtTokens.TRIANGLE_STRIP_ADJACENCY,
			 6 /* number of vertices */, 6 /* expected array length */, GL_TRIANGLES,
			 m_geometry_shader_code_input_triangles_with_adjacency, m_geometry_shader_code_output_triangle_strip);

	m_tests.push_back(&m_test_triangles_adjacency_to_triangle_strip);

	/* Initialize program objects */
	for (testContainer::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		/* Case instance */
		Case* test = *it;

		/* Init program */
		initCaseProgram(*test, captured_varyings, sizeof(captured_varyings) / sizeof(captured_varyings[0]));
	}

	/* Generate, bind and allocate buffer */
	gl.genBuffers(1, &m_buffer_object_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_object_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_buffer_size, 0 /* no start data */, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create buffer object");

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");
}